

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O2

bool AvalancheTest<Blob<224>,Blob<128>>(pfHash hash,int reps,bool verbose)

{
  bool bVar1;
  allocator_type local_61;
  double local_60;
  value_type_conflict1 local_54;
  vector<int,_std::allocator<int>_> bins;
  Rand r;
  
  Rand::reseed(&r,0xbc91);
  printf("Testing %4d-bit keys -> %3d-bit hashes, %6d reps",0xe0,0x80,reps);
  local_54 = 0;
  std::vector<int,_std::allocator<int>_>::vector(&bins,0x7000,&local_54,&local_61);
  calcBias<Blob<224>,Blob<128>>(hash,&bins,reps,&r,verbose);
  local_60 = maxBias(&bins,reps);
  printf(" worst bias is %f%%",local_60 * 100.0);
  if (0.01 < local_60) {
    printf(" !!!!!");
  }
  bVar1 = local_60 <= 0.01;
  putchar(10);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&bins.super__Vector_base<int,_std::allocator<int>_>);
  return bVar1;
}

Assistant:

bool AvalancheTest ( pfHash hash, const int reps, bool verbose )
{
  Rand r(48273);
  
  const int keybytes = sizeof(keytype);
  const int hashbytes = sizeof(hashtype);

  const int keybits = keybytes * 8;
  const int hashbits = hashbytes * 8;

  printf("Testing %4d-bit keys -> %3d-bit hashes, %6d reps",
         keybits, hashbits, reps);

  //----------

  std::vector<int> bins(keybits*hashbits,0);

  calcBias<keytype,hashtype>(hash,bins,reps,r,verbose);
  
  //----------

  bool result = true;

  double b = maxBias(bins,reps);

  printf(" worst bias is %f%%", b * 100.0);

  if(b > AVALANCHE_FAIL)
  {
    printf(" !!!!!");
    result = false;
  }
  printf("\n");
  return result;
}